

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

bool __thiscall
dxil_spv::SPIRVModule::query_builtin_shader_input(SPIRVModule *this,Id id,BuiltIn *builtin)

{
  bool bVar1;
  pointer this_00;
  BuiltIn *builtin_local;
  Id id_local;
  SPIRVModule *this_local;
  
  this_00 = std::
            unique_ptr<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
            ::operator->(&this->impl);
  bVar1 = Impl::query_builtin_shader_input(this_00,id,builtin);
  return bVar1;
}

Assistant:

bool SPIRVModule::query_builtin_shader_input(spv::Id id, spv::BuiltIn *builtin) const
{
	return impl->query_builtin_shader_input(id, builtin);
}